

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

void deadbook(obj *book2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  uint soon;
  boolean arti_cursed;
  boolean arti2_primed;
  boolean arti1_primed;
  obj *otmp;
  monst *pmStack_20;
  coord mm;
  monst *mtmp2;
  monst *mtmp;
  obj *book2_local;
  
  pline("You turn the pages of the Book of the Dead...");
  discover_object(0x1bd,'\x01','\x01');
  *(uint *)&book2->field_0x4a = *(uint *)&book2->field_0x4a & 0xffffffef | 0x10;
  bVar4 = invocation_pos(&u.uz,u.ux,u.uy);
  if ((bVar4 == '\0') || (bVar4 = On_stairs(u.ux,u.uy), bVar4 != '\0')) {
    if ((*(uint *)&book2->field_0x4a & 1) == 0) {
      if ((*(uint *)&book2->field_0x4a >> 1 & 1) != 0) {
        mtmp2 = level->monlist;
        while (mtmp2 != (monst *)0x0) {
          pmStack_20 = mtmp2->nmon;
          if (((0 < mtmp2->mhp) && ((mtmp2->data->mflags2 & 2) != 0)) &&
             ((viz_array[mtmp2->my][mtmp2->mx] & 2U) != 0)) {
            *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xffbfffff | 0x400000;
            iVar6 = sgn((int)mtmp2->data->maligntyp);
            iVar7 = sgn((int)u.ualign.type);
            if ((iVar6 == iVar7) &&
               (iVar6 = dist2((int)mtmp2->mx,(int)mtmp2->my,(int)u.ux,(int)u.uy), iVar6 < 4)) {
              if (mtmp2->mtame == '\0') {
                tamedog(mtmp2,(obj *)0x0);
              }
              else if (mtmp2->mtame < '\x14') {
                mtmp2->mtame = mtmp2->mtame + '\x01';
              }
            }
            else {
              monflee(mtmp2,0,'\0','\x01');
            }
          }
          mtmp2 = pmStack_20;
        }
        return;
      }
      iVar6 = rn2(3);
      if (iVar6 != 0) {
        if (iVar6 != 1) {
          pline("Oh my!  Your name appears in the book!");
          return;
        }
        pline("The headstones in the cemetery begin to move!");
        return;
      }
      pline("Your ancestors are annoyed with you!");
      return;
    }
  }
  else {
    bVar2 = false;
    bVar3 = false;
    bVar1 = false;
    if ((*(uint *)&book2->field_0x4a & 1) != 0) {
      pline("The runes appear scrambled.  You can\'t read them!");
      return;
    }
    if ((((byte)u.uhave._0_1_ >> 1 & 1) == 0) || (((byte)u.uhave._0_1_ >> 3 & 1) == 0)) {
      pcVar8 = body_part(0xc);
      pline("A chill runs down your %s.",pcVar8);
      if (((byte)u.uhave._0_1_ >> 1 & 1) == 0) {
        You_hear("a faint chime...");
      }
      if (((byte)u.uhave._0_1_ >> 3 & 1) != 0) {
        return;
      }
      pline("Vlad\'s doppelganger is amused.");
      return;
    }
    for (_soon = invent; _soon != (obj *)0x0; _soon = _soon->nobj) {
      if (((_soon->otyp == 0x10b) && (_soon->spe == '\a')) &&
         ((*(uint *)&_soon->field_0x4a >> 0x13 & 1) != 0)) {
        if ((*(uint *)&_soon->field_0x4a & 1) == 0) {
          bVar2 = true;
        }
        else {
          bVar1 = true;
        }
      }
      if ((_soon->otyp == 0x10c) && (moves - _soon->age < 5)) {
        if ((*(uint *)&_soon->field_0x4a & 1) == 0) {
          bVar3 = true;
        }
        else {
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      pline("The invocation fails!");
      pline("At least one of your artifacts is cursed...");
      return;
    }
    if ((bVar2) && (bVar3)) {
      uVar5 = dice(2,6);
      mkinvokearea();
      u.uevent._0_2_ = u.uevent._0_2_ & 0xfdff | 0x200;
      historic_event('\0',"performed the invocation.");
      u.uevent._0_2_ = u.uevent._0_2_ & 0xdfff | 0x2000;
      if ((u.udg_cnt != 0) && (u.udg_cnt <= uVar5)) {
        return;
      }
      u.udg_cnt = uVar5;
      return;
    }
    pline("You have a feeling that something is amiss...");
  }
  pline("You raised the dead!");
  iVar6 = rn2(3);
  if ((iVar6 == 0) &&
     ((mtmp2 = makemon(mons + 0xbf,level,(int)u.ux,(int)u.uy,1), mtmp2 != (monst *)0x0 ||
      (mtmp2 = makemon(mons + 0x138,level,(int)u.ux,(int)u.uy,1), mtmp2 != (monst *)0x0)))) {
    *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xffbfffff;
    set_malign(mtmp2);
  }
  unturn_dead(&youmonst);
  otmp._6_1_ = u.ux;
  otmp._7_1_ = u.uy;
  mkundead(level,(coord *)((long)&otmp + 6),'\x01',1);
  return;
}

Assistant:

static void deadbook(struct obj *book2)
{
    struct monst *mtmp, *mtmp2;
    coord mm;

    pline("You turn the pages of the Book of the Dead...");
    makeknown(SPE_BOOK_OF_THE_DEAD);
    /* KMH -- Need ->known to avoid "_a_ Book of the Dead" */
    book2->known = 1;
    if (invocation_pos(&u.uz, u.ux, u.uy) && !On_stairs(u.ux, u.uy)) {
	struct obj *otmp;
	boolean arti1_primed = FALSE, arti2_primed = FALSE,
			 arti_cursed = FALSE;

	if (book2->cursed) {
	    pline("The runes appear scrambled.  You can't read them!");
	    return;
	}

	if (!u.uhave.bell || !u.uhave.menorah) {
	    pline("A chill runs down your %s.", body_part(SPINE));
	    if (!u.uhave.bell) You_hear("a faint chime...");
	    if (!u.uhave.menorah) pline("Vlad's doppelganger is amused.");
	    return;
	}

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (otmp->otyp == CANDELABRUM_OF_INVOCATION &&
	       otmp->spe == 7 && otmp->lamplit) {
		if (!otmp->cursed) arti1_primed = TRUE;
		else arti_cursed = TRUE;
	    }
	    if (otmp->otyp == BELL_OF_OPENING &&
	       (moves - otmp->age) < 5L) { /* you rang it recently */
		if (!otmp->cursed) arti2_primed = TRUE;
		else arti_cursed = TRUE;
	    }
	}

	if (arti_cursed) {
	    pline("The invocation fails!");
	    pline("At least one of your artifacts is cursed...");
	} else if (arti1_primed && arti2_primed) {
	    unsigned soon = (unsigned) dice(2,6);	/* time til next intervene() */

	    /* successful invocation */
	    mkinvokearea();
	    u.uevent.invoked = 1;
	    historic_event(FALSE, "performed the invocation.");
	    /* in case you haven't killed the Wizard yet, behave as if
	       you just did */
	    u.uevent.udemigod = 1;	/* wizdead() */
	    if (!u.udg_cnt || u.udg_cnt > soon) u.udg_cnt = soon;
	} else {	/* at least one artifact not prepared properly */
	    pline("You have a feeling that something is amiss...");
	    goto raise_dead;
	}
	return;
    }

    /* when not an invocation situation */
    if (book2->cursed) {
raise_dead:

	pline("You raised the dead!");
	/* first maybe place a dangerous adversary */
	if (!rn2(3) && ((mtmp = makemon(&mons[PM_MASTER_LICH], level,
					u.ux, u.uy, NO_MINVENT)) != 0 ||
			(mtmp = makemon(&mons[PM_NALFESHNEE], level,
					u.ux, u.uy, NO_MINVENT)) != 0)) {
	    mtmp->mpeaceful = 0;
	    set_malign(mtmp);
	}
	/* next handle the affect on things you're carrying */
	unturn_dead(&youmonst);
	/* last place some monsters around you */
	mm.x = u.ux;
	mm.y = u.uy;
	mkundead(level, &mm, TRUE, NO_MINVENT);
    } else if (book2->blessed) {
	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;		/* tamedog() changes chain */
	    if (DEADMONSTER(mtmp)) continue;

	    if (is_undead(mtmp->data) && cansee(mtmp->mx, mtmp->my)) {
		mtmp->mpeaceful = TRUE;
		if (sgn(mtmp->data->maligntyp) == sgn(u.ualign.type)
		   && distu(mtmp->mx, mtmp->my) < 4)
		    if (mtmp->mtame) {
			if (mtmp->mtame < 20)
			    mtmp->mtame++;
		    } else
			tamedog(mtmp, NULL);
		else monflee(mtmp, 0, FALSE, TRUE);
	    }
	}
    } else {
	switch(rn2(3)) {
	case 0:
	    pline("Your ancestors are annoyed with you!");
	    break;
	case 1:
	    pline("The headstones in the cemetery begin to move!");
	    break;
	default:
	    pline("Oh my!  Your name appears in the book!");
	}
    }
    return;
}